

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::addCmd
          (IMC_Generator *this,HexOp operation,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp)

{
  CodeBase *pCVar1;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  undefined1 local_38 [24];
  shared_ptr<nigel::IM_Operator> *rOp_local;
  shared_ptr<nigel::IM_Operator> *lOp_local;
  IMC_Generator *pIStack_10;
  HexOp operation_local;
  IMC_Generator *this_local;
  
  pCVar1 = this->base;
  local_38._16_8_ = rOp;
  rOp_local = lOp;
  lOp_local._4_4_ = operation;
  pIStack_10 = this;
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_48,lOp);
  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_58,rOp);
  generateCmd((IMC_Generator *)local_38,operation,&local_48,&local_58);
  std::__cxx11::
  list<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>::
  push_back(&pCVar1->imCommands,(value_type *)local_38);
  std::shared_ptr<nigel::IM_Command>::~shared_ptr((shared_ptr<nigel::IM_Command> *)local_38);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_58);
  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_48);
  return;
}

Assistant:

void IMC_Generator::addCmd( HexOp operation, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp )
	{
		base->imCommands.push_back( generateCmd( operation, lOp, rOp ) );
	}